

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

bool __thiscall GlobOpt::CanCSEArrayStore(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *this_00;
  undefined4 *puVar3;
  IndirOpnd *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  RegOpnd *pRStack_30;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Opnd *arrayOpnd;
  Instr *instr_local;
  GlobOpt *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x38a,"(arrayOpnd->IsIndirOpnd())","arrayOpnd->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_01 = IR::Opnd::AsIndirOpnd(this_00);
  pRStack_30 = IR::IndirOpnd::GetBaseOpnd(this_01);
  local_32.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_30->super_Opnd);
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32.field_0);
  return bVar2;
}

Assistant:

bool
GlobOpt::CanCSEArrayStore(IR::Instr *instr)
{
    IR::Opnd *arrayOpnd = instr->GetDst();
    Assert(arrayOpnd->IsIndirOpnd());
    IR::RegOpnd *baseOpnd = arrayOpnd->AsIndirOpnd()->GetBaseOpnd();

    ValueType baseValueType(baseOpnd->GetValueType());

    // Only handle definite arrays for now.  Typed Arrays would require truncation of the CSE'd value.
    if (!baseValueType.IsArrayOrObjectWithArray())
    {
        return false;
    }

    return true;
}